

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testMoveColumnBefore(tst_RoleMaskProxyModel *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ModelTest *this_00;
  QModelIndex local_c58;
  QModelIndex local_c40;
  QVariant local_c28;
  QModelIndex local_c08;
  QModelIndex local_bf0;
  QVariant local_bd8;
  QModelIndex local_bb8;
  QModelIndex local_ba0;
  QVariant local_b88;
  QModelIndex local_b68;
  QModelIndex local_b50;
  QVariant local_b38;
  QModelIndex local_b18;
  QModelIndex local_b00;
  QVariant local_ae8;
  QModelIndex local_ac8;
  QModelIndex local_ab0;
  QVariant local_a98;
  QModelIndex local_a78;
  QModelIndex local_a60;
  QVariant local_a48;
  QModelIndex local_a28;
  QModelIndex local_a10;
  QVariant local_9f8;
  QModelIndex local_9d8;
  QModelIndex local_9c0;
  QVariant local_9a8;
  QModelIndex local_988;
  QModelIndex local_970;
  QVariant local_958;
  QModelIndex local_938;
  QModelIndex local_920;
  QModelIndex local_908;
  QModelIndex local_8f0;
  QVariant local_8d8;
  QModelIndex local_8b8;
  QModelIndex local_8a0;
  QVariant local_888;
  QModelIndex local_868;
  QModelIndex local_850;
  QVariant local_838;
  QModelIndex local_818;
  QModelIndex local_800;
  QVariant local_7e8;
  QModelIndex local_7c8;
  QModelIndex local_7b0;
  QVariant local_798;
  QModelIndex local_778;
  QModelIndex local_760;
  QVariant local_748;
  QModelIndex local_728;
  QModelIndex local_710;
  QVariant local_6f8;
  QModelIndex local_6d8;
  QModelIndex local_6c0;
  QVariant local_6a8;
  QModelIndex local_688;
  QModelIndex local_670;
  QVariant local_658;
  QModelIndex local_638;
  QModelIndex local_620;
  QVariant local_608;
  QModelIndex local_5e8;
  QModelIndex local_5d0;
  QModelIndex local_5b8;
  QModelIndex local_5a0;
  QVariant local_588;
  QModelIndex local_568;
  QModelIndex local_550;
  QVariant local_538;
  QModelIndex local_518;
  QModelIndex local_500;
  QVariant local_4e8;
  QModelIndex local_4c8;
  QModelIndex local_4b0;
  QVariant local_498;
  QModelIndex local_478;
  QModelIndex local_460;
  QVariant local_448;
  QModelIndex local_428;
  QModelIndex local_410;
  QModelIndex local_3f8;
  QModelIndex local_3e0;
  QVariant local_3c8;
  QModelIndex local_3a8;
  QModelIndex local_390;
  QVariant local_378;
  QModelIndex local_358;
  QModelIndex local_340;
  QVariant local_328;
  QModelIndex local_308;
  QModelIndex local_2f0;
  QVariant local_2d8;
  QModelIndex local_2b8;
  QModelIndex local_2a0;
  QVariant local_288;
  QModelIndex local_268;
  QModelIndex local_250;
  QVariant local_238;
  QModelIndex local_218;
  undefined1 local_200 [48];
  int local_1d0;
  undefined4 local_1cc;
  int i_1;
  QModelIndex local_1a8;
  undefined1 local_190 [52];
  int local_15c;
  int i;
  QModelIndex local_140;
  QPersistentModelIndex local_128 [8];
  QPersistentModelIndex proxyParentIdx;
  RoleMaskProxyModel proxyModel;
  QModelIndex local_108;
  QModelIndex local_f0;
  QModelIndex local_d8;
  QModelIndex local_c0;
  QModelIndex local_a8;
  QPersistentModelIndex local_90 [8];
  QPersistentModelIndex parentIdx;
  QModelIndex local_70;
  QModelIndex local_48;
  undefined1 local_30 [8];
  GenericModel baseModel;
  anon_class_1_0_00000001 local_11;
  tst_RoleMaskProxyModel *ptStack_10;
  anon_class_1_0_00000001 fillData;
  tst_RoleMaskProxyModel *this_local;
  
  ptStack_10 = this;
  GenericModel::GenericModel((GenericModel *)local_30,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_48);
  GenericModel::insertColumns((int)(GenericModel *)local_30,0,(QModelIndex *)0x5);
  QModelIndex::QModelIndex(&local_70);
  GenericModel::insertRows((int)local_30,0,(QModelIndex *)0x2);
  QModelIndex::QModelIndex((QModelIndex *)&parentIdx);
  testMoveColumnBefore::anon_class_1_0_00000001::operator()
            (&local_11,(QAbstractItemModel *)local_30,(QModelIndex *)&parentIdx,0);
  QModelIndex::QModelIndex(&local_c0);
  GenericModel::index((int)&local_a8,(int)local_30,(QModelIndex *)0x1);
  QPersistentModelIndex::QPersistentModelIndex(local_90,&local_a8);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d8,local_90);
  GenericModel::insertColumns((int)local_30,0,(QModelIndex *)0x5);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_f0,local_90);
  GenericModel::insertRows((int)local_30,0,(QModelIndex *)0x2);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_108,local_90);
  testMoveColumnBefore::anon_class_1_0_00000001::operator()
            (&local_11,(QAbstractItemModel *)local_30,&local_108,0x32);
  RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)&proxyParentIdx,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyParentIdx,(QObject *)local_30);
  RoleMaskProxyModel::addMaskedRole((int)&proxyParentIdx);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyParentIdx);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&stack0xfffffffffffffea8,local_90);
  QIdentityProxyModel::mapFromSource(&local_140);
  QPersistentModelIndex::QPersistentModelIndex(local_128,&local_140);
  local_15c = 0;
  while( true ) {
    iVar3 = local_15c;
    QModelIndex::QModelIndex((QModelIndex *)(local_190 + 0x18));
    iVar2 = QIdentityProxyModel::columnCount((QModelIndex *)&proxyParentIdx);
    if (iVar2 <= iVar3) break;
    QModelIndex::QModelIndex(&local_1a8);
    QIdentityProxyModel::index((int)local_190,(int)&proxyParentIdx,(QModelIndex *)0x0);
    QVariant::QVariant((QVariant *)&i_1,local_15c + 1000);
    bVar1 = RoleMaskProxyModel::setData
                      ((QModelIndex *)&proxyParentIdx,(QVariant *)local_190,(int)&i_1);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                           "proxyModel.setData(proxyModel.index(0, i), 1000 + i, Qt::UserRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x185);
    QVariant::~QVariant((QVariant *)&i_1);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_1cc = 1;
      goto LAB_001162ff;
    }
    local_15c = local_15c + 1;
  }
  local_1d0 = 0;
  do {
    iVar3 = local_1d0;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)(local_200 + 0x18),local_128)
    ;
    iVar2 = QIdentityProxyModel::columnCount((QModelIndex *)&proxyParentIdx);
    if (iVar2 <= iVar3) {
      QModelIndex::QModelIndex(&local_250);
      QModelIndex::QModelIndex(&local_268);
      bVar1 = GenericModel::moveColumns
                        ((QModelIndex *)local_30,(int)&local_250,4,(QModelIndex *)0x1,
                         (int)&local_268);
      bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                             "baseModel.moveColumns(QModelIndex(), 4, 1, QModelIndex(), 1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x188);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        QModelIndex::QModelIndex(&local_2b8);
        QIdentityProxyModel::index((int)&local_2a0,(int)&proxyParentIdx,(QModelIndex *)0x0);
        QModelIndex::data(&local_288,&local_2a0,0x100);
        iVar3 = QVariant::toInt((bool *)&local_288);
        bVar1 = QTest::qCompare(iVar3,1000,"proxyModel.index(0, 0).data(Qt::UserRole).toInt()",
                                "1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x189);
        QVariant::~QVariant(&local_288);
        if (((bVar1 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex(&local_308);
          QIdentityProxyModel::index((int)&local_2f0,(int)&proxyParentIdx,(QModelIndex *)0x0);
          QModelIndex::data(&local_2d8,&local_2f0,0x100);
          iVar3 = QVariant::toInt((bool *)&local_2d8);
          bVar1 = QTest::qCompare(iVar3,0x3ec,"proxyModel.index(0, 1).data(Qt::UserRole).toInt()",
                                  "1004",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x18a);
          QVariant::~QVariant(&local_2d8);
          if (((bVar1 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_358);
            QIdentityProxyModel::index((int)&local_340,(int)&proxyParentIdx,(QModelIndex *)0x0);
            QModelIndex::data(&local_328,&local_340,0x100);
            iVar3 = QVariant::toInt((bool *)&local_328);
            bVar1 = QTest::qCompare(iVar3,0x3e9,"proxyModel.index(0, 2).data(Qt::UserRole).toInt()",
                                    "1001",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                    ,0x18b);
            QVariant::~QVariant(&local_328);
            if (((bVar1 ^ 0xff) & 1) == 0) {
              QModelIndex::QModelIndex(&local_3a8);
              QIdentityProxyModel::index((int)&local_390,(int)&proxyParentIdx,(QModelIndex *)0x0);
              QModelIndex::data(&local_378,&local_390,0x100);
              iVar3 = QVariant::toInt((bool *)&local_378);
              bVar1 = QTest::qCompare(iVar3,0x3ea,
                                      "proxyModel.index(0, 3).data(Qt::UserRole).toInt()","1002",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0x18c);
              QVariant::~QVariant(&local_378);
              if (((bVar1 ^ 0xff) & 1) == 0) {
                QModelIndex::QModelIndex(&local_3f8);
                QIdentityProxyModel::index((int)&local_3e0,(int)&proxyParentIdx,(QModelIndex *)0x0);
                QModelIndex::data(&local_3c8,&local_3e0,0x100);
                iVar3 = QVariant::toInt((bool *)&local_3c8);
                bVar1 = QTest::qCompare(iVar3,0x3eb,
                                        "proxyModel.index(0, 4).data(Qt::UserRole).toInt()","1003",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0x18d);
                QVariant::~QVariant(&local_3c8);
                if (((bVar1 ^ 0xff) & 1) == 0) {
                  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_410,local_90);
                  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_428,local_90);
                  bVar1 = GenericModel::moveColumns
                                    ((QModelIndex *)local_30,(int)&local_410,4,(QModelIndex *)0x1,
                                     (int)&local_428);
                  bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                                         "baseModel.moveColumns(parentIdx, 4, 1, parentIdx, 0)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                         ,0x18e);
                  if (((bVar1 ^ 0xff) & 1) == 0) {
                    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_478,local_128);
                    QIdentityProxyModel::index
                              ((int)&local_460,(int)&proxyParentIdx,(QModelIndex *)0x0);
                    QModelIndex::data(&local_448,&local_460,0x100);
                    iVar3 = QVariant::toInt((bool *)&local_448);
                    bVar1 = QTest::qCompare(iVar3,0x7d4,
                                            "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                            ,"2004",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                            ,399);
                    QVariant::~QVariant(&local_448);
                    if (((bVar1 ^ 0xff) & 1) == 0) {
                      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_4c8,local_128);
                      QIdentityProxyModel::index
                                ((int)&local_4b0,(int)&proxyParentIdx,(QModelIndex *)0x0);
                      QModelIndex::data(&local_498,&local_4b0,0x100);
                      iVar3 = QVariant::toInt((bool *)&local_498);
                      bVar1 = QTest::qCompare(iVar3,2000,
                                              "proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt()"
                                              ,"2000",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                              ,400);
                      QVariant::~QVariant(&local_498);
                      if (((bVar1 ^ 0xff) & 1) == 0) {
                        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_518,local_128);
                        QIdentityProxyModel::index
                                  ((int)&local_500,(int)&proxyParentIdx,(QModelIndex *)0x0);
                        QModelIndex::data(&local_4e8,&local_500,0x100);
                        iVar3 = QVariant::toInt((bool *)&local_4e8);
                        bVar1 = QTest::qCompare(iVar3,0x7d1,
                                                "proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                ,"2001",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0x191);
                        QVariant::~QVariant(&local_4e8);
                        if (((bVar1 ^ 0xff) & 1) == 0) {
                          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_568,local_128);
                          QIdentityProxyModel::index
                                    ((int)&local_550,(int)&proxyParentIdx,(QModelIndex *)0x0);
                          QModelIndex::data(&local_538,&local_550,0x100);
                          iVar3 = QVariant::toInt((bool *)&local_538);
                          bVar1 = QTest::qCompare(iVar3,0x7d2,
                                                  "proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x192);
                          QVariant::~QVariant(&local_538);
                          if (((bVar1 ^ 0xff) & 1) == 0) {
                            QPersistentModelIndex::operator_cast_to_QModelIndex
                                      (&local_5b8,local_128);
                            QIdentityProxyModel::index
                                      ((int)&local_5a0,(int)&proxyParentIdx,(QModelIndex *)0x0);
                            QModelIndex::data(&local_588,&local_5a0,0x100);
                            iVar3 = QVariant::toInt((bool *)&local_588);
                            bVar1 = QTest::qCompare(iVar3,0x7d3,
                                                                                                        
                                                  "proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x193);
                            QVariant::~QVariant(&local_588);
                            if (((bVar1 ^ 0xff) & 1) == 0) {
                              QPersistentModelIndex::operator_cast_to_QModelIndex
                                        (&local_5d0,local_90);
                              QModelIndex::QModelIndex(&local_5e8);
                              bVar1 = GenericModel::moveColumns
                                                ((QModelIndex *)local_30,(int)&local_5d0,3,
                                                 (QModelIndex *)0x1,(int)&local_5e8);
                              bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                                                                                                          
                                                  "baseModel.moveColumns(parentIdx, 3, 1, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x194);
                              if (((bVar1 ^ 0xff) & 1) == 0) {
                                QPersistentModelIndex::operator_cast_to_QModelIndex
                                          (&local_638,local_128);
                                QIdentityProxyModel::index
                                          ((int)&local_620,(int)&proxyParentIdx,(QModelIndex *)0x0);
                                QModelIndex::data(&local_608,&local_620,0x100);
                                iVar3 = QVariant::toInt((bool *)&local_608);
                                bVar1 = QTest::qCompare(iVar3,0x7d4,
                                                                                                                
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x195);
                                QVariant::~QVariant(&local_608);
                                if (((bVar1 ^ 0xff) & 1) == 0) {
                                  QPersistentModelIndex::operator_cast_to_QModelIndex
                                            (&local_688,local_128);
                                  QIdentityProxyModel::index
                                            ((int)&local_670,(int)&proxyParentIdx,(QModelIndex *)0x0
                                            );
                                  QModelIndex::data(&local_658,&local_670,0x100);
                                  iVar3 = QVariant::toInt((bool *)&local_658);
                                  bVar1 = QTest::qCompare(iVar3,2000,
                                                                                                                    
                                                  "proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x196);
                                  QVariant::~QVariant(&local_658);
                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                    QPersistentModelIndex::operator_cast_to_QModelIndex
                                              (&local_6d8,local_128);
                                    QIdentityProxyModel::index
                                              ((int)&local_6c0,(int)&proxyParentIdx,
                                               (QModelIndex *)0x0);
                                    QModelIndex::data(&local_6a8,&local_6c0,0x100);
                                    iVar3 = QVariant::toInt((bool *)&local_6a8);
                                    bVar1 = QTest::qCompare(iVar3,0x7d1,
                                                                                                                        
                                                  "proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x197);
                                    QVariant::~QVariant(&local_6a8);
                                    if (((bVar1 ^ 0xff) & 1) == 0) {
                                      QPersistentModelIndex::operator_cast_to_QModelIndex
                                                (&local_728,local_128);
                                      QIdentityProxyModel::index
                                                ((int)&local_710,(int)&proxyParentIdx,
                                                 (QModelIndex *)0x0);
                                      QModelIndex::data(&local_6f8,&local_710,0x100);
                                      iVar3 = QVariant::toInt((bool *)&local_6f8);
                                      bVar1 = QTest::qCompare(iVar3,0x7d3,
                                                                                                                            
                                                  "proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x198);
                                      QVariant::~QVariant(&local_6f8);
                                      if (((bVar1 ^ 0xff) & 1) == 0) {
                                        QModelIndex::QModelIndex(&local_778);
                                        QIdentityProxyModel::index
                                                  ((int)&local_760,(int)&proxyParentIdx,
                                                   (QModelIndex *)0x0);
                                        QModelIndex::data(&local_748,&local_760,0x100);
                                        iVar3 = QVariant::toInt((bool *)&local_748);
                                        bVar1 = QTest::qCompare(iVar3,0x7d2,
                                                                                                                                
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x199);
                                        QVariant::~QVariant(&local_748);
                                        if (((bVar1 ^ 0xff) & 1) == 0) {
                                          QModelIndex::QModelIndex(&local_7c8);
                                          QIdentityProxyModel::index
                                                    ((int)&local_7b0,(int)&proxyParentIdx,
                                                     (QModelIndex *)0x0);
                                          QModelIndex::data(&local_798,&local_7b0,0x100);
                                          iVar3 = QVariant::toInt((bool *)&local_798);
                                          bVar1 = QTest::qCompare(iVar3,1000,
                                                                                                                                    
                                                  "proxyModel.index(0, 1).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19a);
                                          QVariant::~QVariant(&local_798);
                                          if (((bVar1 ^ 0xff) & 1) == 0) {
                                            QModelIndex::QModelIndex(&local_818);
                                            QIdentityProxyModel::index
                                                      ((int)&local_800,(int)&proxyParentIdx,
                                                       (QModelIndex *)0x0);
                                            QModelIndex::data(&local_7e8,&local_800,0x100);
                                            iVar3 = QVariant::toInt((bool *)&local_7e8);
                                            bVar1 = QTest::qCompare(iVar3,0x3ec,
                                                                                                                                        
                                                  "proxyModel.index(0, 2).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19b);
                                            QVariant::~QVariant(&local_7e8);
                                            if (((bVar1 ^ 0xff) & 1) == 0) {
                                              QModelIndex::QModelIndex(&local_868);
                                              QIdentityProxyModel::index
                                                        ((int)&local_850,(int)&proxyParentIdx,
                                                         (QModelIndex *)0x0);
                                              QModelIndex::data(&local_838,&local_850,0x100);
                                              iVar3 = QVariant::toInt((bool *)&local_838);
                                              bVar1 = QTest::qCompare(iVar3,0x3e9,
                                                                                                                                            
                                                  "proxyModel.index(0, 3).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19c);
                                              QVariant::~QVariant(&local_838);
                                              if (((bVar1 ^ 0xff) & 1) == 0) {
                                                QModelIndex::QModelIndex(&local_8b8);
                                                QIdentityProxyModel::index
                                                          ((int)&local_8a0,(int)&proxyParentIdx,
                                                           (QModelIndex *)0x0);
                                                QModelIndex::data(&local_888,&local_8a0,0x100);
                                                iVar3 = QVariant::toInt((bool *)&local_888);
                                                bVar1 = QTest::qCompare(iVar3,0x3ea,
                                                                                                                                                
                                                  "proxyModel.index(0, 4).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19d);
                                                QVariant::~QVariant(&local_888);
                                                if (((bVar1 ^ 0xff) & 1) == 0) {
                                                  QModelIndex::QModelIndex(&local_908);
                                                  QIdentityProxyModel::index
                                                            ((int)&local_8f0,(int)&proxyParentIdx,
                                                             (QModelIndex *)0x0);
                                                  QModelIndex::data(&local_8d8,&local_8f0,0x100);
                                                  iVar3 = QVariant::toInt((bool *)&local_8d8);
                                                  bVar1 = QTest::qCompare(iVar3,0x3eb,
                                                                                                                                                    
                                                  "proxyModel.index(0, 5).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19e);
                                                  QVariant::~QVariant(&local_8d8);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_920);
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_938,local_90);
                                                    bVar1 = GenericModel::moveColumns
                                                                      ((QModelIndex *)local_30,
                                                                       (int)&local_920,4,
                                                                       (QModelIndex *)0x1,
                                                                       (int)&local_938);
                                                    bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                                                                                                                                                      
                                                  "baseModel.moveColumns(QModelIndex(), 4, 1, parentIdx, 1)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19f);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_988);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_970,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_958,&local_970,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_958);
                                                    bVar1 = QTest::qCompare(iVar3,0x7d2,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a0);
                                                  QVariant::~QVariant(&local_958);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_9d8);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_9c0,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_9a8,&local_9c0,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_9a8);
                                                    bVar1 = QTest::qCompare(iVar3,1000,
                                                                                                                                                        
                                                  "proxyModel.index(0, 1).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a1);
                                                  QVariant::~QVariant(&local_9a8);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a28);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a10,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_9f8,&local_a10,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_9f8);
                                                    bVar1 = QTest::qCompare(iVar3,0x3ec,
                                                                                                                                                        
                                                  "proxyModel.index(0, 2).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a2);
                                                  QVariant::~QVariant(&local_9f8);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a78);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a60,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_a48,&local_a60,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_a48);
                                                    bVar1 = QTest::qCompare(iVar3,0x3e9,
                                                                                                                                                        
                                                  "proxyModel.index(0, 3).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a3);
                                                  QVariant::~QVariant(&local_a48);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_ac8);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_ab0,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_a98,&local_ab0,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_a98);
                                                    bVar1 = QTest::qCompare(iVar3,0x3eb,
                                                                                                                                                        
                                                  "proxyModel.index(0, 4).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a4);
                                                  QVariant::~QVariant(&local_a98);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_b18,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_b00,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_ae8,&local_b00,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_ae8);
                                                    bVar1 = QTest::qCompare(iVar3,0x7d4,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a5);
                                                  QVariant::~QVariant(&local_ae8);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_b68,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_b50,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_b38,&local_b50,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_b38);
                                                    bVar1 = QTest::qCompare(iVar3,0x3ea,
                                                                                                                                                        
                                                  "proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a6);
                                                  QVariant::~QVariant(&local_b38);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_bb8,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_ba0,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_b88,&local_ba0,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_b88);
                                                    bVar1 = QTest::qCompare(iVar3,2000,
                                                                                                                                                        
                                                  "proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a7);
                                                  QVariant::~QVariant(&local_b88);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_c08,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_bf0,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_bd8,&local_bf0,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_bd8);
                                                    bVar1 = QTest::qCompare(iVar3,0x7d1,
                                                                                                                                                        
                                                  "proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a8);
                                                  QVariant::~QVariant(&local_bd8);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_c58,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_c40,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_c28,&local_c40,0x100);
                                                    iVar3 = QVariant::toInt((bool *)&local_c28);
                                                    bVar1 = QTest::qCompare(iVar3,0x7d3,
                                                                                                                                                        
                                                  "proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a9);
                                                  QVariant::~QVariant(&local_c28);
                                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                                    local_1cc = 0;
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                }
                                                else {
                                                  local_1cc = 1;
                                                }
                                              }
                                              else {
                                                local_1cc = 1;
                                              }
                                            }
                                            else {
                                              local_1cc = 1;
                                            }
                                          }
                                          else {
                                            local_1cc = 1;
                                          }
                                        }
                                        else {
                                          local_1cc = 1;
                                        }
                                      }
                                      else {
                                        local_1cc = 1;
                                      }
                                    }
                                    else {
                                      local_1cc = 1;
                                    }
                                  }
                                  else {
                                    local_1cc = 1;
                                  }
                                }
                                else {
                                  local_1cc = 1;
                                }
                              }
                              else {
                                local_1cc = 1;
                              }
                            }
                            else {
                              local_1cc = 1;
                            }
                          }
                          else {
                            local_1cc = 1;
                          }
                        }
                        else {
                          local_1cc = 1;
                        }
                      }
                      else {
                        local_1cc = 1;
                      }
                    }
                    else {
                      local_1cc = 1;
                    }
                  }
                  else {
                    local_1cc = 1;
                  }
                }
                else {
                  local_1cc = 1;
                }
              }
              else {
                local_1cc = 1;
              }
            }
            else {
              local_1cc = 1;
            }
          }
          else {
            local_1cc = 1;
          }
        }
        else {
          local_1cc = 1;
        }
      }
      else {
        local_1cc = 1;
      }
LAB_001162ff:
      QPersistentModelIndex::~QPersistentModelIndex(local_128);
      RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)&proxyParentIdx);
      QPersistentModelIndex::~QPersistentModelIndex(local_90);
      GenericModel::~GenericModel((GenericModel *)local_30);
      return;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_218,local_128);
    QIdentityProxyModel::index((int)local_200,(int)&proxyParentIdx,(QModelIndex *)0x0);
    QVariant::QVariant(&local_238,local_1d0 + 2000);
    bVar1 = RoleMaskProxyModel::setData
                      ((QModelIndex *)&proxyParentIdx,(QVariant *)local_200,(int)&local_238);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                           "proxyModel.setData(proxyModel.index(0, i, proxyParentIdx), 2000 + i, Qt::UserRole)"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x187);
    QVariant::~QVariant(&local_238);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_1cc = 1;
      goto LAB_001162ff;
    }
    local_1d0 = local_1d0 + 1;
  } while( true );
}

Assistant:

void tst_RoleMaskProxyModel::testMoveColumnBefore()
{
#ifdef QTMODELUTILITIES_GENERICMODEL
    const auto fillData = [](QAbstractItemModel *model, const QModelIndex &parent = QModelIndex(), int shift = 0) {
        for (int i = 0, maxI = model->rowCount(parent); i < maxI; ++i) {
            for (int j = 0, maxJ = model->columnCount(parent); j < maxJ; ++j) {
                model->setData(model->index(i, j, parent), i + shift, Qt::UserRole);
                model->setData(model->index(i, j, parent), j + shift, Qt::UserRole + 1);
            }
        }
    };
    GenericModel baseModel;
    baseModel.insertColumns(0, 5);
    baseModel.insertRows(0, 2);
    fillData(&baseModel);
    const QPersistentModelIndex parentIdx = baseModel.index(1, 0);
    baseModel.insertColumns(0, 5, parentIdx);
    baseModel.insertRows(0, 2, parentIdx);
    fillData(&baseModel, parentIdx, 50);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, &baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(&baseModel);
    const QPersistentModelIndex proxyParentIdx = proxyModel.mapFromSource(parentIdx);
    for (int i = 0; i < proxyModel.columnCount(); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(0, i), 1000 + i, Qt::UserRole));
    for (int i = 0; i < proxyModel.columnCount(proxyParentIdx); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(0, i, proxyParentIdx), 2000 + i, Qt::UserRole));
    QVERIFY(baseModel.moveColumns(QModelIndex(), 4, 1, QModelIndex(), 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(0, 1).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(0, 2).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(0, 3).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(0, 4).data(Qt::UserRole).toInt(), 1003);
    QVERIFY(baseModel.moveColumns(parentIdx, 4, 1, parentIdx, 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QVERIFY(baseModel.moveColumns(parentIdx, 3, 1, QModelIndex(), 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(0, 1).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(0, 2).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(0, 3).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(0, 4).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(0, 5).data(Qt::UserRole).toInt(), 1003);
    QVERIFY(baseModel.moveColumns(QModelIndex(), 4, 1, parentIdx, 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(0, 1).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(0, 2).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(0, 3).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(0, 4).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
#else
    QSKIP("This test requires the GenericModel module");
#endif
}